

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void dump_reg_vec(bit_vec v)

{
  short *in_RDI;
  int j;
  int i;
  int local_10;
  int local_c;
  
  if (in_RDI != (short *)0x0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      for (local_10 = 0; local_10 < 7; local_10 = local_10 + 1) {
        if (((int)*(char *)((long)in_RDI + (long)local_c + 2) & 1 << ((byte)local_10 & 0x1f)) != 0)
        {
          printf(" R%d",(ulong)(local_c * 8 + local_10 + 100));
        }
      }
    }
  }
  return;
}

Assistant:

static void
dump_reg_vec(bit_vec v)
{
    int i;
    if (v == NULL)
        return;
    for (i = 0; i < v->len; i++) {
        int j;
        for (j = 0; j < 7; j++) {
            if ((v->vec[i] & (1 << j)) != 0) {
                printf(" R%d", i * 8 + j + 100);
            }
        }
    }
}